

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall gulps::message::message(message *this,message *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  
  this->lvl = param_2->lvl;
  this->time = param_2->time;
  paVar1 = &(this->cat_major).field_2;
  (this->cat_major)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_2->cat_major)._M_dataplus._M_p;
  paVar4 = &(param_2->cat_major).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(param_2->cat_major).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->cat_major).field_2 + 8) = uVar3;
  }
  else {
    (this->cat_major)._M_dataplus._M_p = pcVar2;
    (this->cat_major).field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->cat_major)._M_string_length = (param_2->cat_major)._M_string_length;
  (param_2->cat_major)._M_dataplus._M_p = (pointer)paVar4;
  (param_2->cat_major)._M_string_length = 0;
  (param_2->cat_major).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->cat_minor).field_2;
  (this->cat_minor)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_2->cat_minor)._M_dataplus._M_p;
  paVar4 = &(param_2->cat_minor).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(param_2->cat_minor).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->cat_minor).field_2 + 8) = uVar3;
  }
  else {
    (this->cat_minor)._M_dataplus._M_p = pcVar2;
    (this->cat_minor).field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->cat_minor)._M_string_length = (param_2->cat_minor)._M_string_length;
  (param_2->cat_minor)._M_dataplus._M_p = (pointer)paVar4;
  (param_2->cat_minor)._M_string_length = 0;
  (param_2->cat_minor).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->src_path).field_2;
  (this->src_path)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_2->src_path)._M_dataplus._M_p;
  paVar4 = &(param_2->src_path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(param_2->src_path).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->src_path).field_2 + 8) = uVar3;
  }
  else {
    (this->src_path)._M_dataplus._M_p = pcVar2;
    (this->src_path).field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->src_path)._M_string_length = (param_2->src_path)._M_string_length;
  (param_2->src_path)._M_dataplus._M_p = (pointer)paVar4;
  (param_2->src_path)._M_string_length = 0;
  (param_2->src_path).field_2._M_local_buf[0] = '\0';
  this->src_line = param_2->src_line;
  paVar1 = &(this->thread_id).field_2;
  (this->thread_id)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_2->thread_id)._M_dataplus._M_p;
  paVar4 = &(param_2->thread_id).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(param_2->thread_id).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->thread_id).field_2 + 8) = uVar3;
  }
  else {
    (this->thread_id)._M_dataplus._M_p = pcVar2;
    (this->thread_id).field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->thread_id)._M_string_length = (param_2->thread_id)._M_string_length;
  (param_2->thread_id)._M_dataplus._M_p = (pointer)paVar4;
  (param_2->thread_id)._M_string_length = 0;
  (param_2->thread_id).field_2._M_local_buf[0] = '\0';
  paVar1 = &(this->text).field_2;
  (this->text)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_2->text)._M_dataplus._M_p;
  paVar4 = &(param_2->text).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&(param_2->text).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->text).field_2 + 8) = uVar3;
  }
  else {
    (this->text)._M_dataplus._M_p = pcVar2;
    (this->text).field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->text)._M_string_length = (param_2->text)._M_string_length;
  (param_2->text)._M_dataplus._M_p = (pointer)paVar4;
  (param_2->text)._M_string_length = 0;
  (param_2->text).field_2._M_local_buf[0] = '\0';
  this->clr = param_2->clr;
  return;
}

Assistant:

message(message&& ) = default;